

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

int archive_write_pax_finish_entry(archive_write *a)

{
  long *plVar1;
  long *plVar2;
  long *__ptr;
  int iVar3;
  long lVar4;
  
  plVar1 = (long *)a->format_data;
  lVar4 = *plVar1;
  if (lVar4 == 0) {
    lVar4 = 0;
    __ptr = (long *)plVar1[0xc];
    while (__ptr != (long *)0x0) {
      if ((int)__ptr[1] == 0) {
        lVar4 = lVar4 + __ptr[3];
      }
      plVar2 = (long *)*__ptr;
      free(__ptr);
      plVar1[0xc] = (long)plVar2;
      __ptr = plVar2;
    }
  }
  iVar3 = __archive_write_nulls(a,lVar4 + plVar1[1]);
  *plVar1 = 0;
  plVar1[1] = 0;
  return iVar3;
}

Assistant:

static int
archive_write_pax_finish_entry(struct archive_write *a)
{
	struct pax *pax;
	uint64_t remaining;
	int ret;

	pax = (struct pax *)a->format_data;
	remaining = pax->entry_bytes_remaining;
	if (remaining == 0) {
		while (pax->sparse_list) {
			struct sparse_block *sb;
			if (!pax->sparse_list->is_hole)
				remaining += pax->sparse_list->remaining;
			sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}
	}
	ret = __archive_write_nulls(a, (size_t)(remaining + pax->entry_padding));
	pax->entry_bytes_remaining = pax->entry_padding = 0;
	return (ret);
}